

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeLiteGenerator::GetBuildCommand
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf,
          string *targetName)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string make;
  string generator;
  ostringstream ss;
  allocator local_1f9;
  allocator local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  allocator local_1b8 [32];
  ostream local_198;
  
  std::__cxx11::string::string((string *)&local_198,"CMAKE_GENERATOR",local_1f8);
  pcVar2 = cmMakefile::GetSafeDefinition(mf,(string *)&local_198);
  std::__cxx11::string::string((string *)&local_1d8,pcVar2,local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string((string *)&local_198,"CMAKE_MAKE_PROGRAM",local_1b8);
  pcVar2 = cmMakefile::GetRequiredDefinition(mf,(string *)&local_198);
  std::__cxx11::string::string((string *)local_1f8,pcVar2,&local_1f9);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_1f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  bVar1 = std::operator==(&local_1d8,"NMake Makefiles");
  if (!bVar1) {
    bVar1 = std::operator==(&local_1d8,"Ninja");
    if (!bVar1) {
      bVar1 = std::operator==(&local_1d8,"MinGW Makefiles");
      if (!bVar1) {
        bVar1 = std::operator==(&local_1d8,"Unix Makefiles");
        if (!bVar1) goto LAB_00446b90;
      }
      poVar3 = std::operator<<(&local_198,(string *)local_1f8);
      poVar3 = std::operator<<(poVar3," -j ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      goto LAB_00446b90;
    }
  }
  std::operator<<(&local_198,(string *)local_1f8);
LAB_00446b90:
  if (targetName->_M_string_length != 0) {
    poVar3 = std::operator<<(&local_198," ");
    std::operator<<(poVar3,(string *)targetName);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetBuildCommand(
  const cmMakefile* mf, const std::string& targetName) const
{
  std::string generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string buildCommand = make; // Default
  std::ostringstream ss;
  if (generator == "NMake Makefiles" || generator == "Ninja") {
    ss << make;
  } else if (generator == "MinGW Makefiles" || generator == "Unix Makefiles") {
    ss << make << " -j " << this->CpuCount;
  }
  if (!targetName.empty()) {
    ss << " " << targetName;
  }
  buildCommand = ss.str();
  return buildCommand;
}